

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manual-optimizer.cpp
# Opt level: O2

void __thiscall
manual_course::manual_course
          (manual_course *this,double theta_,double delta_,double kappa_min_,double kappa_step_,
          double init_policy_random_,int length_)

{
  _Head_base<0UL,_double_*,_false> _Var1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  
  std::make_unique<double[]>((size_t)this);
  std::make_unique<double[]>((size_t)&this->delta);
  std::make_unique<double[]>((size_t)&this->kappa_min);
  std::make_unique<double[]>((size_t)&this->kappa_step);
  std::make_unique<double[]>((size_t)&this->init_policy_random);
  std::make_unique<int[]>((size_t)&this->iterators);
  this->length = length_;
  if (2 < length_) {
    _Var1._M_head_impl =
         (this->theta)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    *_Var1._M_head_impl = theta_;
    dVar9 = (double)length_;
    _Var1._M_head_impl[1] = 1.0 / dVar9;
    pdVar2 = (this->delta)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    *pdVar2 = delta_;
    pdVar2[1] = 0.1 / dVar9;
    pdVar3 = (this->kappa_min)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
             _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    *pdVar3 = kappa_min_;
    pdVar3[1] = 0.01 / dVar9;
    pdVar4 = (this->kappa_step)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
             _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    *pdVar4 = kappa_step_;
    pdVar4[1] = 1e-07 / dVar9;
    pdVar5 = (this->init_policy_random)._M_t.
             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    *pdVar5 = init_policy_random_;
    pdVar5[1] = 0.9 / dVar9;
    for (uVar7 = 2; (uint)length_ != uVar7; uVar7 = uVar7 + 1) {
      _Var1._M_head_impl[uVar7] = 1.0 / dVar9 + _Var1._M_head_impl[uVar7 - 1];
    }
    lVar6 = (ulong)(uint)length_ - 2;
    for (lVar8 = 0; lVar6 != lVar8; lVar8 = lVar8 + 1) {
      pdVar2[lVar8 + 2] = 0.1 / (dVar9 * 5.0) + _Var1._M_head_impl[lVar8 + 1];
    }
    for (lVar8 = 0; lVar6 != lVar8; lVar8 = lVar8 + 1) {
      pdVar3[lVar8 + 2] = 0.01 / dVar9 + _Var1._M_head_impl[lVar8 + 1];
    }
    for (lVar8 = 0; lVar6 != lVar8; lVar8 = lVar8 + 1) {
      pdVar4[lVar8 + 2] = 1e-07 / (dVar9 * 5.0) + _Var1._M_head_impl[lVar8 + 1];
    }
    for (lVar8 = 0; lVar6 != lVar8; lVar8 = lVar8 + 1) {
      pdVar5[lVar8 + 2] = 0.9 / dVar9 + _Var1._M_head_impl[lVar8 + 1];
    }
    reset(this);
    return;
  }
  baryonyx::details::fail_fast
            ("Postcondition","length > 2",
             "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/manual-optimizer.cpp"
             ,"56");
}

Assistant:

manual_course(double theta_,
                  double delta_,
                  double kappa_min_,
                  double kappa_step_,
                  double init_policy_random_,
                  int length_)
      : theta(std::make_unique<double[]>(length_))
      , delta(std::make_unique<double[]>(length_))
      , kappa_min(std::make_unique<double[]>(length_))
      , kappa_step(std::make_unique<double[]>(length_))
      , init_policy_random(std::make_unique<double[]>(length_))
      , iterators(std::make_unique<int[]>(length_))
      , length(length_)
    {
        bx_ensures(length > 2);

        theta[0] = theta_;
        theta[1] = 1.0 / static_cast<double>(length);

        delta[0] = delta_;
        delta[1] = 0.1 / static_cast<double>(length);

        kappa_min[0] = kappa_min_;
        kappa_min[1] = 1e-2 / static_cast<double>(length);

        kappa_step[0] = kappa_step_;
        kappa_step[1] = 1e-7 / static_cast<double>(length);

        init_policy_random[0] = init_policy_random_;
        init_policy_random[1] = 0.9 / static_cast<double>(length);

        for (int i = 2; i != length; ++i)
            theta[i] = theta[i - 1] + 1.0 / static_cast<double>(length);

        for (int i = 2; i != length; ++i)
            delta[i] =
              theta[i - 1] + 0.1 / (5.0 * static_cast<double>(length));

        for (int i = 2; i != length; ++i)
            kappa_min[i] = theta[i - 1] + 1e-2 / static_cast<double>(length);

        for (int i = 2; i != length; ++i)
            kappa_step[i] =
              theta[i - 1] + 1e-7 / (5.0 * static_cast<double>(length));

        for (int i = 2; i != length; ++i)
            init_policy_random[i] =
              theta[i - 1] + 0.9 / static_cast<double>(length);

        reset();
    }